

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O1

Am_Value bottom_of_sibling_procedure(Am_Object *self)

{
  long *plVar1;
  float fVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Am_Value *pAVar7;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Key in_SI;
  double dVar8;
  Am_Value AVar9;
  Am_Object object;
  Am_Object local_30;
  Am_Object local_28;
  long *plVar6;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  iVar4 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  Am_Object::Get_Object(&local_28,in_SI,10);
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)&local_28,(ulong)*(ushort *)((long)plVar6 + 0xc));
  Am_Object::~Am_Object(&local_28);
  pAVar7 = Am_Object::Get(&local_30,0x65,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_30,0x67,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  Am_Value::operator=((Am_Value *)self,iVar5 + iVar4);
  plVar1 = plVar6 + 1;
  *(int *)plVar1 = (int)*plVar1 + -1;
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar6 + 0x20))(plVar6);
  }
  iVar4 = (int)plVar6[2];
  fVar2 = *(float *)((long)plVar6 + 0x14);
  uVar3 = *(ushort *)&self->data;
  if (uVar3 - 2 < 2) {
    self[1].data = (Am_Object_Data *)((long)(fVar2 * (float)(long)self[1].data) + (long)iVar4);
  }
  else if (uVar3 == 5) {
    *(float *)&self[1].data = fVar2 * *(float *)&self[1].data + (float)iVar4;
  }
  else if (uVar3 == 0x8006) {
    dVar8 = Am_Value::operator_cast_to_double((Am_Value *)self);
    Am_Value::operator=((Am_Value *)self,dVar8 * (double)fVar2 + (double)iVar4);
  }
  Am_Object::~Am_Object(&local_30);
  AVar9.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar9._0_8_ = self;
  return AVar9;
}

Assistant:

static Am_Value
bottom_of_sibling_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Offset_Store_Data *store =
      (Part_Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()
          ->Get_Data();
  Am_Object object = self.Get_Owner().Get_Object(store->part);
  value = (int)object.Get(Am_TOP) + (int)object.Get(Am_HEIGHT);
  store->Release();
  modify_value(value, store->offset, store->multiplier);
  return value;
}